

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

int pack_sign_cp(ECDSA_SIG *s,int order,uchar *sig,size_t *siglen)

{
  BIGNUM *sig_s;
  BIGNUM *sig_r;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  local_38 = (BIGNUM *)0x0;
  local_40 = (BIGNUM *)0x0;
  ECDSA_SIG_get0(s,&local_38,&local_40);
  *siglen = (long)(order * 2);
  memset(sig,0,(long)(order * 2));
  store_bignum(local_40,sig,order);
  store_bignum(local_38,sig + order,order);
  ECDSA_SIG_free((ECDSA_SIG *)s);
  return 1;
}

Assistant:

int pack_sign_cp(ECDSA_SIG *s, int order, unsigned char *sig, size_t *siglen)
{
    const BIGNUM *sig_r = NULL, *sig_s = NULL;
    ECDSA_SIG_get0(s, &sig_r, &sig_s);
    *siglen = 2 * order;
    memset(sig, 0, *siglen);
    store_bignum(sig_s, sig, order);
    store_bignum(sig_r, sig + order, order);
    ECDSA_SIG_free(s);
    return 1;
}